

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialRenderer.cpp
# Opt level: O1

bool __thiscall
irr::video::COpenGL3MaterialRenderer::createShader
          (COpenGL3MaterialRenderer *this,GLenum shaderType,char *shader)

{
  GLint GVar1;
  GLint GVar2;
  GLuint GVar3;
  Printer *this_00;
  double dVar4;
  GLint length;
  GLint maxLength;
  GLint status;
  char *local_40;
  GLsizei local_34;
  GLint local_30;
  GLint local_2c;
  
  if (this->Program != 0) {
    local_40 = shader;
    GVar3 = (*GL.CreateShader)(shaderType);
    (*GL.ShaderSource)(GVar3,1,&local_40,(GLint *)0x0);
    (*GL.CompileShader)(GVar3);
    local_2c = 0;
    dVar4 = (double)(*GL.GetShaderiv)(GVar3,0x8b81,&local_2c);
    GVar2 = local_2c;
    if (local_2c == 1) {
      (*GL.AttachShader)(this->Program,GVar3);
    }
    else {
      os::Printer::log((Printer *)"GLSL shader failed to compile",dVar4);
      local_30 = 0;
      (*GL.GetShaderiv)(GVar3,0x8b84,&local_30);
      GVar1 = local_30;
      if ((long)local_30 != 0) {
        this_00 = (Printer *)operator_new__((long)local_30);
        dVar4 = (double)(*GL.GetShaderInfoLog)(GVar3,GVar1,&local_34,(GLchar *)this_00);
        os::Printer::log(this_00,dVar4);
        operator_delete__(this_00);
      }
    }
    if (GVar2 != 1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool COpenGL3MaterialRenderer::createShader(GLenum shaderType, const char *shader)
{
	if (Program) {
		GLuint shaderHandle = GL.CreateShader(shaderType);
		GL.ShaderSource(shaderHandle, 1, &shader, NULL);
		GL.CompileShader(shaderHandle);

		GLint status = 0;

		GL.GetShaderiv(shaderHandle, GL_COMPILE_STATUS, &status);

		if (status != GL_TRUE) {
			os::Printer::log("GLSL shader failed to compile", ELL_ERROR);

			GLint maxLength = 0;
			GLint length;

			GL.GetShaderiv(shaderHandle, GL_INFO_LOG_LENGTH,
					&maxLength);

			if (maxLength) {
				GLchar *infoLog = new GLchar[maxLength];
				GL.GetShaderInfoLog(shaderHandle, maxLength, &length, infoLog);
				os::Printer::log(reinterpret_cast<const c8 *>(infoLog), ELL_ERROR);
				delete[] infoLog;
			}

			return false;
		}

		GL.AttachShader(Program, shaderHandle);
	}

	return true;
}